

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSatG.c
# Opt level: O0

Cec3_Man_t * Cec3_ManCreate(Gia_Man_t *pAig,Cec3_Par_t *pPars)

{
  int iVar1;
  uint uVar2;
  Cec3_Man_t *__s;
  abctime aVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  bmcg_sat_solver *pbVar6;
  Vec_Ptr_t *pVVar7;
  Vec_Int_t *pVVar8;
  bool bVar9;
  int local_2c;
  Gia_Obj_t *pGStack_28;
  int i;
  Gia_Obj_t *pObj;
  Cec3_Man_t *p;
  Cec3_Par_t *pPars_local;
  Gia_Man_t *pAig_local;
  
  __s = (Cec3_Man_t *)calloc(1,0xa0);
  memset(__s,0,0xa0);
  aVar3 = Abc_Clock();
  __s->timeStart = aVar3;
  __s->pPars = pPars;
  __s->pAig = pAig;
  iVar1 = Gia_ManObjNum(pAig);
  pGVar4 = Gia_ManStart(iVar1);
  __s->pNew = pGVar4;
  Gia_ManFillValue(pAig);
  pGVar5 = Gia_ManConst0(pAig);
  pGVar5->Value = 0;
  local_2c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(pAig->vCis);
    bVar9 = false;
    if (local_2c < iVar1) {
      pGStack_28 = Gia_ManCi(pAig,local_2c);
      bVar9 = pGStack_28 != (Gia_Obj_t *)0x0;
    }
    if (!bVar9) break;
    uVar2 = Gia_ManAppendCi(__s->pNew);
    pGStack_28->Value = uVar2;
    local_2c = local_2c + 1;
  }
  Gia_ManHashAlloc(__s->pNew);
  pGVar4 = __s->pNew;
  iVar1 = Gia_ManObjNum(__s->pNew);
  Vec_IntFill(&pGVar4->vCopies2,iVar1,-1);
  pbVar6 = bmcg_sat_solver_start();
  __s->pSat = pbVar6;
  pVVar7 = Vec_PtrAlloc(1000);
  __s->vFrontier = pVVar7;
  pVVar7 = Vec_PtrAlloc(100);
  __s->vFanins = pVVar7;
  pVVar8 = Vec_IntAlloc(100);
  __s->vNodesNew = pVVar8;
  pVVar8 = Vec_IntAlloc(100);
  __s->vSatVars = pVVar8;
  pVVar8 = Vec_IntAlloc(100);
  __s->vObjSatPairs = pVVar8;
  pVVar8 = Vec_IntAlloc(100);
  __s->vCexTriples = pVVar8;
  pAig->pData = __s->pSat;
  return __s;
}

Assistant:

Cec3_Man_t * Cec3_ManCreate( Gia_Man_t * pAig, Cec3_Par_t * pPars )
{
    Cec3_Man_t * p;
    Gia_Obj_t * pObj; int i;
    //satoko_opts_t Pars;
    //assert( Gia_ManRegNum(pAig) == 0 );
    p = ABC_CALLOC( Cec3_Man_t, 1 );
    memset( p, 0, sizeof(Cec3_Man_t) );
    p->timeStart    = Abc_Clock();
    p->pPars        = pPars;
    p->pAig         = pAig;
    // create new manager
    p->pNew         = Gia_ManStart( Gia_ManObjNum(pAig) );
    Gia_ManFillValue( pAig );
    Gia_ManConst0(pAig)->Value = 0;
    Gia_ManForEachCi( pAig, pObj, i )
        pObj->Value = Gia_ManAppendCi( p->pNew );
    Gia_ManHashAlloc( p->pNew );
    Vec_IntFill( &p->pNew->vCopies2, Gia_ManObjNum(p->pNew), -1 );
    // SAT solving
    //memset( &Pars, 0, sizeof(satoko_opts_t) );
    p->pSat         = bmcg_sat_solver_start();
    p->vFrontier    = Vec_PtrAlloc( 1000 );
    p->vFanins      = Vec_PtrAlloc( 100 );
    p->vNodesNew    = Vec_IntAlloc( 100 );
    p->vSatVars     = Vec_IntAlloc( 100 );
    p->vObjSatPairs = Vec_IntAlloc( 100 );
    p->vCexTriples  = Vec_IntAlloc( 100 );
    //Pars.conf_limit = pPars->nConfLimit;
    //satoko_configure(p->pSat, &Pars);
    // remember pointer to the solver in the AIG manager
    pAig->pData     = p->pSat;
    return p;
}